

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O2

encryption_method_e
QPDF::interpretCF(shared_ptr<QPDF::EncryptionParameters> *encp,QPDFObjectHandle *cf)

{
  bool bVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  encryption_method_e eVar4;
  string filter;
  string local_40;
  
  bVar1 = QPDFObjectHandle::isName(cf);
  eVar4 = e_none;
  if (bVar1) {
    QPDFObjectHandle::getName_abi_cxx11_(&local_40,cf);
    sVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF::encryption_method_e,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF::encryption_method_e>_>_>
            ::count(&((encp->
                      super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->crypt_filters,&local_40);
    if (sVar2 == 0) {
      bVar1 = std::operator==(&local_40,"/Identity");
      eVar4 = (encryption_method_e)!bVar1;
    }
    else {
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF::encryption_method_e,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF::encryption_method_e>_>_>
               ::operator[](&((encp->
                              super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr)->crypt_filters,&local_40);
      eVar4 = *pmVar3;
    }
    std::__cxx11::string::~string((string *)&local_40);
  }
  return eVar4;
}

Assistant:

QPDF::encryption_method_e
QPDF::interpretCF(std::shared_ptr<EncryptionParameters> encp, QPDFObjectHandle cf)
{
    if (cf.isName()) {
        std::string filter = cf.getName();
        if (encp->crypt_filters.count(filter) != 0) {
            return encp->crypt_filters[filter];
        } else if (filter == "/Identity") {
            return e_none;
        } else {
            return e_unknown;
        }
    } else {
        // Default: /Identity
        return e_none;
    }
}